

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O2

void __thiscall
cinatra::coro_http_client::coro_http_client(coro_http_client *this,executor_type *executor)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  allocator<char> local_39;
  basic_executor_type<std::allocator<void>,_0UL> local_38;
  
  (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
  super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
  super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  http_parser::http_parser(&this->parser_);
  local_38.target_ = executor->target_;
  coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
  ExecutorWrapper(&this->executor_wrapper_,&local_38);
  coro_io::period_timer::
  period_timer<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>
            (&this->timer_,&this->executor_wrapper_);
  std::
  make_shared<cinatra::coro_http_client::socket_t,asio::io_context::basic_executor_type<std::allocator<void>,0ul>&>
            ((basic_executor_type<std::allocator<void>,_0UL> *)&this->socket_);
  peVar2 = (this->socket_).
           super___shared_ptr<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this->head_buf_ = &peVar2->head_buf_;
  this->chunked_buf_ = &peVar2->chunked_buf_;
  (this->body_)._M_dataplus._M_p = (pointer)&(this->body_).field_2;
  (this->body_)._M_string_length = 0;
  (this->body_).field_2._M_local_buf[0] = '\0';
  (this->req_headers_)._M_h._M_buckets = &(this->req_headers_)._M_h._M_single_bucket;
  (this->req_headers_)._M_h._M_bucket_count = 1;
  (this->req_headers_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->req_headers_)._M_h._M_element_count = 0;
  (this->req_headers_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->req_headers_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->req_headers_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->proxy_request_uri_,"",&local_39);
  (this->proxy_host_)._M_dataplus._M_p = (pointer)&(this->proxy_host_).field_2;
  (this->proxy_host_)._M_string_length = 0;
  (this->proxy_host_).field_2._M_local_buf[0] = '\0';
  (this->proxy_port_)._M_dataplus._M_p = (pointer)&(this->proxy_port_).field_2;
  (this->proxy_port_)._M_string_length = 0;
  (this->proxy_port_).field_2._M_local_buf[0] = '\0';
  (this->proxy_basic_auth_username_)._M_dataplus._M_p =
       (pointer)&(this->proxy_basic_auth_username_).field_2;
  (this->proxy_basic_auth_username_)._M_string_length = 0;
  (this->proxy_basic_auth_username_).field_2._M_local_buf[0] = '\0';
  (this->proxy_basic_auth_password_)._M_dataplus._M_p =
       (pointer)&(this->proxy_basic_auth_password_).field_2;
  (this->proxy_basic_auth_password_)._M_string_length = 0;
  (this->proxy_basic_auth_password_).field_2._M_local_buf[0] = '\0';
  (this->proxy_bearer_token_auth_token_)._M_dataplus._M_p =
       (pointer)&(this->proxy_bearer_token_auth_token_).field_2;
  (this->proxy_bearer_token_auth_token_)._M_string_length = 0;
  (this->proxy_bearer_token_auth_token_).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->form_data_)._M_t._M_impl.super__Rb_tree_header;
  (this->form_data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->form_data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->form_data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->form_data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->form_data_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->max_single_part_size_ = 0x100000;
  (this->ws_sec_key_)._M_dataplus._M_p = (pointer)&(this->ws_sec_key_).field_2;
  (this->ws_sec_key_)._M_string_length = 0;
  (this->ws_sec_key_).field_2._M_local_buf[0] = '\0';
  (this->host_)._M_dataplus._M_p = (pointer)&(this->host_).field_2;
  (this->host_)._M_string_length = 0;
  (this->host_).field_2._M_local_buf[0] = '\0';
  (this->port_)._M_dataplus._M_p = (pointer)&(this->port_).field_2;
  (this->port_)._M_string_length = 0;
  (this->port_).field_2._M_local_buf[0] = '\0';
  (this->redirect_uri_)._M_dataplus._M_p = (pointer)&(this->redirect_uri_).field_2;
  (this->redirect_uri_)._M_string_length = 0;
  (this->redirect_uri_).field_2._M_local_buf[0] = '\0';
  this->enable_follow_redirect_ = false;
  (this->conn_timeout_duration_).__r = 30000000000;
  (this->req_timeout_duration_).__r = 60000000000;
  this->enable_tcp_no_delay_ = true;
  (this->resp_chunk_str_)._M_dataplus._M_p = (pointer)&(this->resp_chunk_str_).field_2;
  (this->resp_chunk_str_)._M_string_length = 0;
  (this->resp_chunk_str_).field_2._M_local_buf[0] = '\0';
  this->should_reset_ = false;
  (this->out_buf_)._M_ptr = (pointer)0x0;
  (this->out_buf_)._M_extent._M_extent_value = 0;
  config::config(&this->config_);
  this->enable_ws_deflate_ = false;
  this->is_server_support_ws_deflate_ = false;
  (this->inflate_str_)._M_dataplus._M_p = (pointer)&(this->inflate_str_).field_2;
  (this->inflate_str_)._M_string_length = 0;
  (this->inflate_str_).field_2._M_local_buf[0] = '\0';
  this->encoding_type_ = none;
  this->max_http_body_len_ = 0x100000000;
  (this->uncompressed_str_)._M_dataplus._M_p = (pointer)&(this->uncompressed_str_).field_2;
  (this->uncompressed_str_)._M_string_length = 0;
  (this->uncompressed_str_).field_2._M_local_buf[0] = '\0';
  this->write_failed_forever_ = false;
  this->connect_timeout_forever_ = false;
  this->parse_failed_forever_ = false;
  this->read_failed_forever_ = false;
  this->read_failed_forever_ = false;
  this->write_header_timeout_ = false;
  this->write_payload_timeout_ = false;
  this->read_timeout_ = false;
  return;
}

Assistant:

coro_http_client(asio::io_context::executor_type executor)
      : executor_wrapper_(executor),
        timer_(&executor_wrapper_),
        socket_(std::make_shared<socket_t>(executor)),
        head_buf_(socket_->head_buf_),
        chunked_buf_(socket_->chunked_buf_) {}